

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O0

void __thiscall Connection_testTeach_Test::TestBody(Connection_testTeach_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_c8;
  Message local_c0;
  float local_b4;
  Connection local_b0;
  float local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_78 [3];
  float local_5c;
  Connection local_58;
  float local_3c;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  Connection s;
  Connection_testTeach_Test *this_local;
  
  this_00 = &gtest_ar.message_;
  Connection::Connection((Connection *)this_00,(Neuron *)0x0,10.0,100.0,100.0);
  Connection::teach((Connection *)this_00,1.0);
  Connection::Connection(&local_58,(Neuron *)0x0,11.0,100.0,100.0);
  local_3c = Connection::weight(&local_58);
  local_5c = Connection::weight((Connection *)this_00);
  testing::internal::EqHelper<false>::Compare<float,float>
            ((EqHelper<false> *)local_38,"Connection(0, 11).weight()","s.weight()",&local_3c,
             &local_5c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  Connection::teach((Connection *)&gtest_ar.message_,10.0);
  Connection::Connection(&local_b0,(Neuron *)0x0,21.0,100.0,100.0);
  local_94 = Connection::weight(&local_b0);
  local_b4 = Connection::weight((Connection *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<float,float>
            ((EqHelper<false> *)local_90,"Connection(0, 21).weight()","s.weight()",&local_94,
             &local_b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  return;
}

Assistant:

TEST(Connection, testTeach)
{
    Connection s(0, 10);
    s.teach(1);
    EXPECT_EQ(Connection(0, 11).weight(), s.weight());
    s.teach(10);
    EXPECT_EQ(Connection(0, 21).weight(), s.weight());
}